

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::JunitReporter::StartGroup(JunitReporter *this,string *groupName)

{
  IConfig *pIVar1;
  Ptr<Catch::IConfig> local_a0;
  string local_98;
  Stats local_78;
  
  if (groupName->_M_string_length == 0) {
    pIVar1 = (this->m_config).m_fullConfig.m_p;
    local_a0.m_p = pIVar1;
    if (pIVar1 != (IConfig *)0x0) {
      (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(pIVar1);
    }
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(&local_98,pIVar1);
    Stats::Stats(&local_78,&local_98);
    std::vector<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>::
    emplace_back<Catch::JunitReporter::Stats>(&this->m_statsForSuites,&local_78);
    Stats::~Stats(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    Ptr<Catch::IConfig>::~Ptr(&local_a0);
  }
  else {
    Stats::Stats(&local_78,groupName);
    std::vector<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>::
    emplace_back<Catch::JunitReporter::Stats>(&this->m_statsForSuites,&local_78);
    Stats::~Stats(&local_78);
  }
  this->m_currentStats =
       (this->m_statsForSuites).
       super__Vector_base<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>
       ._M_impl.super__Vector_impl_data._M_finish + -1;
  return;
}

Assistant:

virtual void StartGroup( const std::string& groupName ) {
            if( groupName.empty() )
                m_statsForSuites.push_back( Stats( m_config.fullConfig()->name() ) );
            else
                m_statsForSuites.push_back( Stats( groupName ) );
            m_currentStats = &m_statsForSuites.back();
        }